

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O3

void __thiscall indigox::PeriodicTable::GeneratePeriodicTable(PeriodicTable *this)

{
  int iVar1;
  char *pcVar2;
  pointer pcVar3;
  pointer pbVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  Element *this_00;
  String *this_01;
  int iVar12;
  pointer s_00;
  float chi;
  uint8_t local_1b8;
  uint8_t local_1b0;
  uint8_t local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  Element_p elem;
  String n;
  string local_138;
  PeriodicTable *local_118;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>>
  *local_110;
  long local_108;
  long local_100;
  String s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string local_b8;
  String file;
  String path;
  FileReader fr;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118 = this;
  if (Options::DATA_DIRECTORY_abi_cxx11_._M_dataplus._M_p
      [Options::DATA_DIRECTORY_abi_cxx11_._M_string_length - 1] != '/') {
    std::__cxx11::string::append((char *)&Options::DATA_DIRECTORY_abi_cxx11_);
  }
  path._M_dataplus._M_p = (pointer)&path.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&path,Options::DATA_DIRECTORY_abi_cxx11_._M_dataplus._M_p,
             Options::DATA_DIRECTORY_abi_cxx11_._M_dataplus._M_p +
             Options::DATA_DIRECTORY_abi_cxx11_._M_string_length);
  file._M_dataplus._M_p = (pointer)&file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&file,Options::PERIODIC_TABLE_FILE_abi_cxx11_._M_dataplus._M_p,
             Options::PERIODIC_TABLE_FILE_abi_cxx11_._M_dataplus._M_p +
             Options::PERIODIC_TABLE_FILE_abi_cxx11_._M_string_length);
  std::operator+(&n,&path,&file);
  utils::FileReader::FileReader(&fr,&n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)n._M_dataplus._M_p != &n.field_2) {
    operator_delete(n._M_dataplus._M_p,n.field_2._M_allocated_capacity + 1);
  }
  utils::FileReader::GetAllItems(&fr,&lines);
  n._M_dataplus._M_p = (pointer)&n.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&n,"");
  s._M_dataplus._M_p = (pointer)&s.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&s,"");
  pbVar4 = lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_110 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>>
                 *)&local_118->name_to_;
    local_174 = 0.0;
    lVar7 = 0;
    lVar9 = 0;
    local_178 = 0.0;
    local_17c = 0.0;
    local_180 = 0.0;
    lVar6 = 0;
    lVar10 = 0;
    local_100 = 0;
    local_108 = 0;
    iVar12 = 0;
    s_00 = lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      switch(iVar12) {
      case 0:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar8 = __errno_location();
        iVar1 = *piVar8;
        *piVar8 = 0;
        lVar6 = strtol(pcVar2,(char **)&local_1a0,10);
        if (local_1a0._M_dataplus._M_p == pcVar2) {
          std::__throw_invalid_argument("stoi");
LAB_0010fc04:
          std::__throw_out_of_range("stof");
        }
        if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_0010fbec;
        if (*piVar8 == 0) {
          *piVar8 = iVar1;
        }
        break;
      case 1:
        utils::toUpperFirst(&local_1a0,s_00);
        this_01 = &n;
        goto LAB_0010f61d;
      case 2:
        utils::toUpperFirst(&local_1a0,s_00);
        this_01 = &s;
LAB_0010f61d:
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        break;
      case 3:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar8 = __errno_location();
        iVar1 = *piVar8;
        *piVar8 = 0;
        local_180 = strtof(pcVar2,(char **)&local_1a0);
        if (local_1a0._M_dataplus._M_p == pcVar2) {
LAB_0010fbe0:
          std::__throw_invalid_argument("stof");
LAB_0010fbec:
          std::__throw_out_of_range("stoi");
        }
        if (*piVar8 == 0) {
LAB_0010f793:
          *piVar8 = iVar1;
        }
        else if (*piVar8 == 0x22) {
          std::__throw_out_of_range("stof");
        }
        break;
      case 4:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar8 = __errno_location();
        iVar1 = *piVar8;
        *piVar8 = 0;
        lVar7 = strtol(pcVar2,(char **)&local_1a0,10);
        if (local_1a0._M_dataplus._M_p == pcVar2) {
          std::__throw_invalid_argument("stoi");
          goto LAB_0010fbe0;
        }
        if ((lVar7 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_0010fbc8;
        if (*piVar8 == 0) {
          *piVar8 = iVar1;
        }
        break;
      case 5:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar8 = __errno_location();
        iVar1 = *piVar8;
        *piVar8 = 0;
        lVar9 = strtol(pcVar2,(char **)&local_1a0,10);
        if (local_1a0._M_dataplus._M_p == pcVar2) {
          std::__throw_invalid_argument("stoi");
LAB_0010fbc8:
          std::__throw_out_of_range("stoi");
        }
        if ((lVar9 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_0010fbb0;
        if (*piVar8 == 0) {
          *piVar8 = iVar1;
        }
        break;
      case 6:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar8 = __errno_location();
        iVar1 = *piVar8;
        *piVar8 = 0;
        lVar10 = strtol(pcVar2,(char **)&local_1a0,10);
        if (local_1a0._M_dataplus._M_p == pcVar2) {
          std::__throw_invalid_argument("stoi");
LAB_0010fbb0:
          std::__throw_out_of_range("stoi");
        }
        if ((lVar10 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_0010fb98;
        if (*piVar8 == 0) {
          *piVar8 = iVar1;
        }
        break;
      case 7:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar8 = __errno_location();
        iVar1 = *piVar8;
        *piVar8 = 0;
        lVar11 = strtol(pcVar2,(char **)&local_1a0,10);
        if (local_1a0._M_dataplus._M_p == pcVar2) {
          std::__throw_invalid_argument("stoi");
LAB_0010fb98:
          std::__throw_out_of_range("stoi");
        }
        local_100 = lVar11;
        if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (iVar5 = *piVar8, iVar5 == 0x22))
        goto LAB_0010fb80;
        goto LAB_0010f817;
      case 8:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar8 = __errno_location();
        iVar1 = *piVar8;
        *piVar8 = 0;
        lVar11 = strtol(pcVar2,(char **)&local_1a0,10);
        if (local_1a0._M_dataplus._M_p == pcVar2) {
          std::__throw_invalid_argument("stoi");
LAB_0010fb80:
          std::__throw_out_of_range("stoi");
        }
        local_108 = lVar11;
        if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (iVar5 = *piVar8, iVar5 == 0x22))
        goto LAB_0010fb68;
LAB_0010f817:
        if (iVar5 == 0) {
          *piVar8 = iVar1;
        }
        break;
      case 9:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar8 = __errno_location();
        iVar1 = *piVar8;
        *piVar8 = 0;
        local_17c = strtof(pcVar2,(char **)&local_1a0);
        if (local_1a0._M_dataplus._M_p == pcVar2) {
LAB_0010fb5c:
          std::__throw_invalid_argument("stof");
LAB_0010fb68:
          std::__throw_out_of_range("stoi");
        }
        if (*piVar8 == 0) goto LAB_0010f793;
        if (*piVar8 == 0x22) {
          std::__throw_out_of_range("stof");
        }
        break;
      case 10:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar8 = __errno_location();
        iVar1 = *piVar8;
        *piVar8 = 0;
        local_178 = strtof(pcVar2,(char **)&local_1a0);
        if (local_1a0._M_dataplus._M_p == pcVar2) {
LAB_0010fb50:
          std::__throw_invalid_argument("stof");
          goto LAB_0010fb5c;
        }
        if (*piVar8 == 0) goto LAB_0010f793;
        if (*piVar8 == 0x22) {
          std::__throw_out_of_range("stof");
        }
        break;
      case 0xb:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar8 = __errno_location();
        iVar1 = *piVar8;
        *piVar8 = 0;
        local_174 = strtof(pcVar2,(char **)&local_1a0);
        if (local_1a0._M_dataplus._M_p == pcVar2) {
LAB_0010fb44:
          std::__throw_invalid_argument("stof");
          goto LAB_0010fb50;
        }
        if (*piVar8 == 0) goto LAB_0010f793;
        if (*piVar8 == 0x22) {
          std::__throw_out_of_range("stof");
        }
        break;
      case 0xc:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar8 = __errno_location();
        iVar12 = *piVar8;
        *piVar8 = 0;
        chi = strtof(pcVar2,(char **)&local_1a0);
        if (local_1a0._M_dataplus._M_p == pcVar2) {
          std::__throw_invalid_argument("stof");
          goto LAB_0010fb44;
        }
        if (*piVar8 == 0) {
          *piVar8 = iVar12;
        }
        else if (*piVar8 == 0x22) goto LAB_0010fc04;
        this_00 = (Element *)operator_new(0x60);
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,n._M_dataplus._M_p,n._M_dataplus._M_p + n._M_string_length);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,s._M_dataplus._M_p,s._M_dataplus._M_p + s._M_string_length);
        local_1a8 = (uint8_t)lVar10;
        local_1b8 = (uint8_t)lVar6;
        local_1b0 = (uint8_t)lVar9;
        Element::Element(this_00,local_1b8,&local_138,&local_b8,local_180,(uint8_t)lVar7,local_1b0,
                         local_1a8,(uint8_t)local_100,(uint8_t)local_108,local_17c,local_178,
                         local_174,chi);
        elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<indigox::Element*>
                  (&elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,this_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        local_1a0._M_dataplus._M_p._0_1_ =
             (elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->Z_;
        std::
        _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>,std::_Select1st<std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>>>
        ::_M_emplace_unique<unsigned_char,std::shared_ptr<indigox::Element>&>
                  ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>,std::_Select1st<std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>>>
                    *)local_118,(uchar *)&local_1a0,&elem);
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        pcVar3 = ((elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 symbol_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a0,pcVar3,
                   pcVar3 + ((elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->symbol_)._M_string_length);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>>
        ::_M_emplace_unique<std::__cxx11::string,std::shared_ptr<indigox::Element>&>
                  (local_110,&local_1a0,&elem);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        pcVar3 = ((elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a0,pcVar3,
                   pcVar3 + ((elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->name_)._M_string_length);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>>
        ::_M_emplace_unique<std::__cxx11::string,std::shared_ptr<indigox::Element>&>
                  (local_110,&local_1a0,&elem);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if (elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        iVar12 = 0;
        goto LAB_0010f833;
      }
      iVar12 = iVar12 + 1;
LAB_0010f833:
      s_00 = s_00 + 1;
    } while (s_00 != pbVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p,s.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)n._M_dataplus._M_p != &n.field_2) {
    operator_delete(n._M_dataplus._M_p,n.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fr.path_._M_dataplus._M_p != &fr.path_.field_2) {
    operator_delete(fr.path_._M_dataplus._M_p,fr.path_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)file._M_dataplus._M_p != &file.field_2) {
    operator_delete(file._M_dataplus._M_p,file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)path._M_dataplus._M_p != &path.field_2) {
    operator_delete(path._M_dataplus._M_p,path.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lines);
  return;
}

Assistant:

void PeriodicTable::GeneratePeriodicTable() {
    /// @todo Check for duplicate elements and skip them.
    /// @todo Ensure all columns are populated.
    std::vector<String> lines;
    if (Options::DATA_DIRECTORY.back() != '/') {
      Options::DATA_DIRECTORY.append("/");
    }
    String path = Options::DATA_DIRECTORY;
    String file = Options::PERIODIC_TABLE_FILE;
    //if (path.back() != '/') path.append("/");
    utils::FileReader fr(path + file);
    fr.GetAllItems(lines);
    
    String n = "", s = "";
    uint8_t g = 0, p = 0, z = 0, v = 0, o = 0, h = 0;
    Float m = 0.0f, r = 0.0f, c = 0.0f, V = 0.0f, e = 0.0f;
    int count = 0;
    
    for (String& line : lines) {
      switch (count) {
        case 0: z = std::stoi(line); break;
        case 1: n = utils::toUpperFirst(&line); break;
        case 2: s = utils::toUpperFirst(&line); break;
        case 3: m = std::stof(line); break;
        case 4: g = std::stoi(line); break;
        case 5: p = std::stoi(line); break;
        case 6: v = std::stoi(line); break;
        case 7: o = std::stoi(line); break;
        case 8: h = std::stoi(line); break;
        case 9: r = std::stof(line); break;
        case 10: c = std::stof(line); break;
        case 11: V = std::stof(line); break;
        case 12: e = std::stof(line); break;
        default:
          break;
      }
      
      if (count == 12) {
        Element_p elem = Element_p(new Element(z, n, s, m, g, p, v, o, h, r, c,
                                               V, e));
        z_to_.emplace(elem->GetAtomicNumber(), elem);
        name_to_.emplace(elem->GetSymbol(), elem);
        name_to_.emplace(elem->GetName(), elem);
        count = 0;
      } else count++;
    }
  }